

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O2

double __thiscall PriorityBranchGroup::getScore(PriorityBranchGroup *this,VarBranch vb)

{
  uint uVar1;
  Branching *pBVar2;
  uint i;
  ulong uVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  
  dVar4 = 0.0;
  for (uVar3 = 0; uVar1 = (this->super_BranchGroup).x.sz, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    pBVar2 = (this->super_BranchGroup).x.data[uVar3];
    (*pBVar2->_vptr_Branching[1])(pBVar2,vb);
    dVar4 = dVar4 + extraout_XMM0_Qa;
  }
  return dVar4 / (double)uVar1;
}

Assistant:

double PriorityBranchGroup::getScore(VarBranch vb) {
	double sum = 0;
	for (unsigned int i = 0; i < x.size(); i++) {
		sum += x[i]->getScore(vb);
	}
	return sum / x.size();
}